

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
::reserve(raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          *this,size_t n)

{
  long lVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  
  bVar2 = is_soo(this);
  if (bVar2) {
    uVar5 = 1;
  }
  else {
    sVar3 = size(this);
    sVar4 = growth_left(this);
    uVar5 = sVar4 + sVar3;
  }
  if (uVar5 < n) {
    if (n < 0x380000000000001) {
      uVar5 = (n - 1) / 7 + n;
      lVar1 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      resize_impl(this,0xffffffffffffffff >> (~(byte)lVar1 & 0x3f),(n - 1) % 7);
      infoz(this);
      return;
    }
    HashTableSizeOverflow();
  }
  return;
}

Assistant:

void reserve(size_t n) {
    const size_t max_size_before_growth =
        is_soo() ? SooCapacity() : size() + growth_left();
    if (n > max_size_before_growth) {
      if (ABSL_PREDICT_FALSE(n > max_size())) {
        HashTableSizeOverflow();
      }
      size_t m = GrowthToLowerboundCapacity(n);
      resize(NormalizeCapacity(m));

      // This is after resize, to ensure that we have completed the allocation
      // and have potentially sampled the hashtable.
      infoz().RecordReservation(n);
    }
    common().reset_reserved_growth(n);
    common().set_reservation_size(n);
  }